

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll_ifc_symphony.c
# Opt level: O2

int32_t ll_dl_band_cfg_set(llabs_dl_band_cfg_t *p)

{
  _Bool _Var1;
  uint uVar2;
  
  if (p == (llabs_dl_band_cfg_t *)0x0) {
    uVar2 = 0xffffff9b;
  }
  else {
    _Var1 = transport_mutex_grab();
    if (_Var1) {
      ll_dl_band_cfg_serialize(p,_ll_ifc_message_buff);
      uVar2 = hal_read_write(OP_DL_BAND_CFG_SET,_ll_ifc_message_buff,0xe,(uint8_t *)0x0,0);
      transport_mutex_release();
      uVar2 = (int)uVar2 >> 0x1f & uVar2;
    }
    else {
      uVar2 = 0xffffff8f;
    }
  }
  return uVar2;
}

Assistant:

int32_t ll_dl_band_cfg_set(const llabs_dl_band_cfg_t *p)
{
    if (p == NULL)
    {
        return LL_IFC_ERROR_INCORRECT_PARAMETER;
    }

    if (!(transport_mutex_grab()))
    {
        return LL_IFC_ERROR_HAL_CALL_FAILED;
    }

    ll_dl_band_cfg_serialize(p, &_ll_ifc_message_buff[0]);

    int32_t ret = hal_read_write(OP_DL_BAND_CFG_SET, &_ll_ifc_message_buff[0], DL_BAND_CFG_SIZE, NULL, 0);

    transport_mutex_release();

    return (ret >= 0) ? LL_IFC_ACK : ret;
}